

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_forward(mg_connection *c,char *addr)

{
  void **user_data;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  ns_connection *conn;
  __int32_t **pp_Var8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  
  user_data = &c[-1].callback_param;
  conn = ns_connect((ns_mgr *)c[1].request_method,addr,mg_ev_handler,user_data);
  if (conn == (ns_connection *)0x0) {
    *(uint *)((long)*user_data + 0x98) = *(uint *)((long)*user_data + 0x98) | 0x10;
    return 0;
  }
  pbVar1 = (byte *)((long)&conn->flags + 2);
  *pbVar1 = *pbVar1 | 0x80;
  *(undefined4 *)&c[1].http_version = 6;
  c[1].uri = (char *)conn;
  pcVar4 = c->request_method;
  iVar7 = strcmp(pcVar4,"CONNECT");
  if (iVar7 == 0) {
    send(*(int *)((long)*user_data + 0x20),"HTTP/1.1 200 OK\r\n\r\n",0x13,0);
    return 1;
  }
  piVar5 = (int *)c->uri;
  if (*(int *)((long)piVar5 + 3) == 0x2f2f3a70 && *piVar5 == 0x70747468) {
    c->uri = (char *)((long)piVar5 + 7);
  }
  pcVar9 = c->uri;
  while ((*pcVar9 != '\0' && (*pcVar9 != '/'))) {
    pcVar9 = pcVar9 + 1;
    c->uri = pcVar9;
  }
  ns_printf(conn,"%s %s HTTP/%s\r\n",pcVar4,pcVar9,c->http_version);
  if (0 < c->num_headers) {
    pp_Var8 = __ctype_tolower_loc();
    lVar11 = 0;
    bVar6 = false;
    do {
      pcVar4 = c->http_headers[lVar11].name;
      lVar10 = 0;
      do {
        bVar2 = pcVar4[lVar10];
        iVar7 = (*pp_Var8)[bVar2];
        iVar3 = (*pp_Var8)[(byte)"Connection"[lVar10]];
        if (bVar2 == 0) break;
        lVar10 = lVar10 + 1;
      } while (iVar7 == iVar3);
      if (iVar7 == iVar3) {
        ns_printf(conn,"%s: %s\r\n","Connection","close");
        bVar6 = true;
      }
      else {
        ns_printf(conn,"%s: %s\r\n",pcVar4,c->http_headers[lVar11].value);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < c->num_headers);
    if (bVar6) goto LAB_00107a22;
  }
  ns_printf(conn,"%s: %s\r\n","Connection","close");
LAB_00107a22:
  ns_printf(conn,"%s","\r\n");
  ns_out(conn,c->content,(long)(int)c->content_len);
  return 1;
}

Assistant:

int mg_forward(struct mg_connection *c, const char *addr) {
  static const char ok[] = "HTTP/1.1 200 OK\r\n\r\n";
  struct connection *conn = MG_CONN_2_CONN(c);
  struct ns_connection *pc;

  if ((pc = ns_connect(&conn->server->ns_mgr, addr,
      mg_ev_handler, conn)) == NULL) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
    return 0;
  }

  // Interlink two connections
  pc->flags |= MG_PROXY_CONN;
  conn->endpoint_type = EP_PROXY;
  conn->endpoint.nc = pc;
  DBG(("%p [%s] [%s] -> %p %p", conn, c->uri, addr, pc, conn->ns_conn->ssl));

  if (strcmp(c->request_method, "CONNECT") == 0) {
    // For CONNECT request, reply with 200 OK. Tunnel is established.
    // TODO(lsm): check for send() failure
    (void) send(conn->ns_conn->sock, ok, sizeof(ok) - 1, 0);
  } else {
    // Strip "http://host:port" part from the URI
    if (memcmp(c->uri, "http://", 7) == 0) c->uri += 7;
    while (*c->uri != '\0' && *c->uri != '/') c->uri++;
    proxy_request(pc, c);
  }
  return 1;
}